

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

int64_t mtree_atol10(char **p)

{
  char cVar1;
  char *pcVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long local_40;
  bool local_35;
  int sign;
  int digit;
  int base;
  int64_t last_digit_limit;
  int64_t limit;
  int64_t l;
  char **p_local;
  
  if (**p == '-') {
    sign = -1;
    limit = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x8000000000000000)) / ZEXT816(10),0);
    last_digit_limit = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x8000000000000000)) % ZEXT816(10),0);
    *p = *p + 1;
  }
  else {
    sign = 1;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = SUB168(SEXT816(0x7fffffffffffffff),8);
    limit = SUB168((auVar3 << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(10),0);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = SUB168(SEXT816(0x7fffffffffffffff),8);
    last_digit_limit = SUB168((auVar4 << 0x40 | ZEXT816(0x7fffffffffffffff)) % SEXT816(10),0);
  }
  l = 0;
  cVar1 = **p;
  while( true ) {
    digit = cVar1 + -0x30;
    local_35 = 9 < (uint)digit;
    if (local_35) {
      if (sign < 0) {
        local_40 = -l;
      }
      else {
        local_40 = l;
      }
      return local_40;
    }
    if ((limit < l) || ((l == limit && (last_digit_limit < digit)))) break;
    l = l * 10 + (long)digit;
    pcVar2 = *p;
    *p = pcVar2 + 1;
    cVar1 = pcVar2[1];
  }
  if (-1 < sign) {
    return 0x7fffffffffffffff;
  }
  return -0x8000000000000000;
}

Assistant:

static int64_t
mtree_atol10(char **p)
{
	int64_t l, limit, last_digit_limit;
	int base, digit, sign;

	base = 10;

	if (**p == '-') {
		sign = -1;
		limit = ((uint64_t)(INT64_MAX) + 1) / base;
		last_digit_limit = ((uint64_t)(INT64_MAX) + 1) % base;
		++(*p);
	} else {
		sign = 1;
		limit = INT64_MAX / base;
		last_digit_limit = INT64_MAX % base;
	}

	l = 0;
	digit = **p - '0';
	while (digit >= 0 && digit < base) {
		if (l > limit || (l == limit && digit > last_digit_limit))
			return (sign < 0) ? INT64_MIN : INT64_MAX;
		l = (l * base) + digit;
		digit = *++(*p) - '0';
	}
	return (sign < 0) ? -l : l;
}